

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void __thiscall QGles2Texture::destroy(QGles2Texture *this)

{
  long lVar1;
  QList<QRhiGles2::DeferredReleaseEntry> *in_RDI;
  long in_FS_OFFSET;
  QRhiGles2 *rhiD;
  DeferredReleaseEntry e;
  QRhiResource *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)((long)&in_RDI[4].d.d + 4) != 0) {
    *(undefined4 *)((long)&in_RDI[4].d.d + 4) = 0;
    *(undefined1 *)&in_RDI[6].d.ptr = 0;
    *(undefined1 *)((long)&in_RDI[6].d.ptr + 1) = 0;
    if ((in_RDI->d).ptr != (DeferredReleaseEntry *)0x0) {
      if (((ulong)in_RDI[4].d.ptr & 1) != 0) {
        QList<QRhiGles2::DeferredReleaseEntry>::append
                  (in_RDI,(parameter_type)in_stack_ffffffffffffffc8);
      }
      QRhiImplementation::unregisterResource
                ((QRhiImplementation *)0x92d370,in_stack_ffffffffffffffc8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGles2Texture::destroy()
{
    if (!texture)
        return;

    QRhiGles2::DeferredReleaseEntry e;
    e.type = QRhiGles2::DeferredReleaseEntry::Texture;

    e.texture.texture = texture;

    texture = 0;
    specified = false;
    zeroInitialized = false;

    QRHI_RES_RHI(QRhiGles2);
    if (rhiD) {
        if (owns)
            rhiD->releaseQueue.append(e);
        rhiD->unregisterResource(this);
    }
}